

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::endpoints
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Simplex_handle *sh)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *in_RDX;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>
  pVar3;
  __buckets_ptr local_20;
  
  puVar1 = *(undefined8 **)((int *)*in_RDX + 4);
  if (*(int *)(puVar1 + 1) == *(int *)*in_RDX) {
    puVar1 = (undefined8 *)*puVar1;
  }
  if (puVar1 != (undefined8 *)0x0) {
    iVar2 = 2;
    do {
      puVar1 = (undefined8 *)*puVar1;
      iVar2 = iVar2 + -1;
    } while (puVar1 != (undefined8 *)0x0);
    if (iVar2 == 0) {
      find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
                  &stack0xffffffffffffffe0,(Vertex_handle)sh);
      find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
                  &(this->nodes_label_to_list_)._M_h._M_bucket_count,(Vertex_handle)sh);
      (this->nodes_label_to_list_)._M_h._M_buckets = local_20;
      pVar3.second.m_ptr = extraout_RDX.m_ptr;
      pVar3.first.m_ptr =
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
            *)this;
      return pVar3;
    }
  }
  __assert_fail("dimension(sh) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                ,0x498,
                "std::pair<Simplex_handle, Simplex_handle> Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::endpoints(Simplex_handle) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_fast_persistence]"
               );
}

Assistant:

std::pair<Simplex_handle, Simplex_handle> endpoints(Simplex_handle sh) const {
    assert(dimension(sh) == 1);
    return { find_vertex(sh->first), find_vertex(self_siblings(sh)->parent()) };
  }